

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsStructTypes2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsStructTypes2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  string **local_a0;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  string shader_source;
  allocator<char> local_39;
  string local_38 [8];
  string structure_declaration;
  TestShaderType tested_shader_type_local;
  SizedDeclarationsStructTypes2<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  structure_declaration.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,
             "struct MyStructure {\n   float a[2], b[2][2], c[2][2][2], d[2][2][2][2], e[2][2][2][2][2], f[2][2][2][2][2][2], g[2][2][2][2][2][2][2], h[2][2][2][2][2][2][2][2];\n} myStructureObject;\n\n"
             ,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)&cs,local_38);
  std::__cxx11::string::operator+=((string *)&cs,(string *)shader_start_abi_cxx11_);
  switch(structure_declaration.field_2._12_4_) {
  case 0:
    break;
  case 1:
    std::__cxx11::string::operator+=((string *)&cs,"\n\tgl_Position = vec4(0.0);\n");
    break;
  case 2:
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)&cs,(string *)emit_quad_abi_cxx11_);
    break;
  case 4:
    std::__cxx11::string::operator+=((string *)&cs,(string *)set_tesseation_abi_cxx11_);
    break;
  case 5:
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x573);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator+=((string *)&cs,(string *)shader_end_abi_cxx11_);
  vs = (string *)empty_string_abi_cxx11_;
  tcs = (string *)default_vertex_shader_source_abi_cxx11_;
  tes = (string *)default_tc_shader_source_abi_cxx11_;
  gs = (string *)default_te_shader_source_abi_cxx11_;
  fs = (string *)default_geometry_shader_source_abi_cxx11_;
  local_a0 = (string **)default_fragment_shader_source_abi_cxx11_;
  switch(structure_declaration.field_2._12_4_) {
  case 0:
    local_a0 = &cs;
    break;
  case 1:
    tcs = (string *)&cs;
    break;
  case 2:
    vs = (string *)&cs;
    tcs = (string *)empty_string_abi_cxx11_;
    tes = (string *)empty_string_abi_cxx11_;
    gs = (string *)empty_string_abi_cxx11_;
    fs = (string *)empty_string_abi_cxx11_;
    local_a0 = (string **)empty_string_abi_cxx11_;
    break;
  case 3:
    fs = (string *)&cs;
    break;
  case 4:
    tes = (string *)&cs;
    break;
  case 5:
    gs = (string *)&cs;
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x576);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[10])(this,tcs,tes,gs,fs,local_a0,vs,1,0);
  std::__cxx11::string::~string((string *)&cs);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SizedDeclarationsStructTypes2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string structure_declaration = "struct MyStructure {\n"
										"   float a[2], "
										"b[2][2], "
										"c[2][2][2], "
										"d[2][2][2][2], "
										"e[2][2][2][2][2], "
										"f[2][2][2][2][2][2], "
										"g[2][2][2][2][2][2][2], "
										"h[2][2][2][2][2][2][2][2];\n"
										"} myStructureObject;\n\n";
	std::string shader_source = structure_declaration;

	shader_source += shader_start;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
}